

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_extension_loader.cpp
# Opt level: O3

bool duckdb::TryLoadLinkedExtension(DuckDB *db,string *extension)

{
  int iVar1;
  
  iVar1 = ::std::__cxx11::string::compare((char *)extension);
  if (iVar1 == 0) {
    DuckDB::LoadStaticExtension<duckdb::CoreFunctionsExtension>(db);
  }
  else {
    iVar1 = ::std::__cxx11::string::compare((char *)extension);
    if (iVar1 == 0) {
      DuckDB::LoadStaticExtension<duckdb::ParquetExtension>(db);
    }
    else {
      iVar1 = ::std::__cxx11::string::compare((char *)extension);
      if (iVar1 != 0) {
        return false;
      }
      DuckDB::LoadStaticExtension<duckdb::JemallocExtension>(db);
    }
  }
  return true;
}

Assistant:

bool TryLoadLinkedExtension(DuckDB &db, const string &extension) {

  if (extension=="core_functions") {
      db.LoadStaticExtension<CoreFunctionsExtension>();
      return true;
  }
  if (extension=="parquet") {
      db.LoadStaticExtension<ParquetExtension>();
      return true;
  }
  if (extension=="jemalloc") {
      db.LoadStaticExtension<JemallocExtension>();
      return true;
  }

    return false;
}